

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3WalFindFrame(Wal *pWal,Pgno pgno,u32 *piRead)

{
  uint uVar1;
  u32 uVar2;
  u32 uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  u32 iZero;
  u32 *aPgno;
  ht_slot *aHash;
  u32 local_4c;
  u32 *local_48;
  ht_slot *local_40;
  u32 *local_38;
  
  uVar1 = (pWal->hdr).mxFrame;
  if ((uVar1 == 0) || (pWal->readLock == 0)) {
    *piRead = 0;
  }
  else {
    uVar2 = pWal->minFrame;
    uVar8 = (ulong)(uVar1 + 0x1000) + 0xffffffff021 >> 0xc;
    uVar3 = 0;
    local_38 = piRead;
    while( true ) {
      iVar5 = (int)uVar8;
      if ((iVar5 < (int)((ulong)(uVar2 + 0x1000) + 0xffffffff021 >> 0xc)) || (uVar3 != 0)) break;
      iVar4 = walHashGet(pWal,iVar5,&local_40,&local_48,&local_4c);
      if (iVar4 != 0) {
        return iVar4;
      }
      uVar3 = 0;
      iVar4 = -0x2000;
      uVar6 = pgno * 0x17f;
      while( true ) {
        uVar6 = uVar6 & 0x1fff;
        if (local_40[uVar6] == 0) break;
        uVar7 = local_40[uVar6] + local_4c;
        if (((uVar7 <= uVar1) && (pWal->minFrame <= uVar7)) && (local_48[local_40[uVar6]] == pgno))
        {
          uVar3 = uVar7;
        }
        if (iVar4 == 0) {
          iVar5 = sqlite3CorruptError(0xe135);
          return iVar5;
        }
        uVar6 = uVar6 + 1;
        iVar4 = iVar4 + 1;
      }
      uVar8 = (ulong)(iVar5 - 1);
    }
    *local_38 = uVar3;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalFindFrame(
  Wal *pWal,                      /* WAL handle */
  Pgno pgno,                      /* Database page number to read data for */
  u32 *piRead                     /* OUT: Frame number (or zero) */
){
  u32 iRead = 0;                  /* If !=0, WAL frame to return data from */
  u32 iLast = pWal->hdr.mxFrame;  /* Last page in WAL for this reader */
  int iHash;                      /* Used to loop through N hash tables */
  int iMinHash;

  /* This routine is only be called from within a read transaction. */
  assert( pWal->readLock>=0 || pWal->lockError );

  /* If the "last page" field of the wal-index header snapshot is 0, then
  ** no data will be read from the wal under any circumstances. Return early
  ** in this case as an optimization.  Likewise, if pWal->readLock==0, 
  ** then the WAL is ignored by the reader so return early, as if the 
  ** WAL were empty.
  */
  if( iLast==0 || pWal->readLock==0 ){
    *piRead = 0;
    return SQLITE_OK;
  }

  /* Search the hash table or tables for an entry matching page number
  ** pgno. Each iteration of the following for() loop searches one
  ** hash table (each hash table indexes up to HASHTABLE_NPAGE frames).
  **
  ** This code might run concurrently to the code in walIndexAppend()
  ** that adds entries to the wal-index (and possibly to this hash 
  ** table). This means the value just read from the hash 
  ** slot (aHash[iKey]) may have been added before or after the 
  ** current read transaction was opened. Values added after the
  ** read transaction was opened may have been written incorrectly -
  ** i.e. these slots may contain garbage data. However, we assume
  ** that any slots written before the current read transaction was
  ** opened remain unmodified.
  **
  ** For the reasons above, the if(...) condition featured in the inner
  ** loop of the following block is more stringent that would be required 
  ** if we had exclusive access to the hash-table:
  **
  **   (aPgno[iFrame]==pgno): 
  **     This condition filters out normal hash-table collisions.
  **
  **   (iFrame<=iLast): 
  **     This condition filters out entries that were added to the hash
  **     table after the current read-transaction had started.
  */
  iMinHash = walFramePage(pWal->minFrame);
  for(iHash=walFramePage(iLast); iHash>=iMinHash && iRead==0; iHash--){
    volatile ht_slot *aHash;      /* Pointer to hash table */
    volatile u32 *aPgno;          /* Pointer to array of page numbers */
    u32 iZero;                    /* Frame number corresponding to aPgno[0] */
    int iKey;                     /* Hash slot index */
    int nCollide;                 /* Number of hash collisions remaining */
    int rc;                       /* Error code */

    rc = walHashGet(pWal, iHash, &aHash, &aPgno, &iZero);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    nCollide = HASHTABLE_NSLOT;
    for(iKey=walHash(pgno); aHash[iKey]; iKey=walNextHash(iKey)){
      u32 iFrame = aHash[iKey] + iZero;
      if( iFrame<=iLast && iFrame>=pWal->minFrame && aPgno[aHash[iKey]]==pgno ){
        assert( iFrame>iRead || CORRUPT_DB );
        iRead = iFrame;
      }
      if( (nCollide--)==0 ){
        return SQLITE_CORRUPT_BKPT;
      }
    }
  }

#ifdef SQLITE_ENABLE_EXPENSIVE_ASSERT
  /* If expensive assert() statements are available, do a linear search
  ** of the wal-index file content. Make sure the results agree with the
  ** result obtained using the hash indexes above.  */
  {
    u32 iRead2 = 0;
    u32 iTest;
    assert( pWal->minFrame>0 );
    for(iTest=iLast; iTest>=pWal->minFrame; iTest--){
      if( walFramePgno(pWal, iTest)==pgno ){
        iRead2 = iTest;
        break;
      }
    }
    assert( iRead==iRead2 );
  }
#endif

  *piRead = iRead;
  return SQLITE_OK;
}